

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

double __thiscall crnlib::symbol_histogram::calc_entropy(symbol_histogram *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  uVar3 = (ulong)(this->m_hist).m_size;
  dVar6 = 0.0;
  dVar4 = 0.0;
  if (uVar3 != 0) {
    uVar2 = 0;
    do {
      dVar4 = dVar4 + (double)(this->m_hist).m_p[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  if (((dVar4 != 0.0) || (NAN(dVar4))) && ((this->m_hist).m_size != 0)) {
    dVar6 = 0.0;
    uVar3 = 0;
    do {
      uVar1 = (this->m_hist).m_p[uVar3];
      if (uVar1 != 0) {
        dVar5 = log((double)uVar1 * (1.0 / dVar4));
        dVar6 = dVar6 + (double)(this->m_hist).m_p[uVar3] * dVar5 * -1.4426950216293335;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->m_hist).m_size);
  }
  return dVar6;
}

Assistant:

double symbol_histogram::calc_entropy() const {
  double total = 0.0f;
  for (uint i = 0; i < m_hist.size(); i++)
    total += m_hist[i];
  if (total == 0.0f)
    return 0.0f;

  double entropy = 0.0f;
  double neg_inv_log2 = -1.0f / log(2.0f);
  double inv_total = 1.0f / total;
  for (uint i = 0; i < m_hist.size(); i++) {
    if (m_hist[i]) {
      double bits = log(m_hist[i] * inv_total) * neg_inv_log2;
      entropy += bits * m_hist[i];
    }
  }

  return entropy;
}